

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ares_dns_parse.c
# Opt level: O3

ares_status_t
ares_dns_parse_rr(ares_buf_t *buf,uint flags,ares_dns_section_t sect,ares_dns_record_t *dnsrec)

{
  ushort uVar1;
  ushort uVar2;
  ulong rdlength;
  ares_status_t aVar3;
  ares_bool_t aVar4;
  uint uVar5;
  size_t sVar6;
  size_t sVar7;
  uint uVar8;
  ares_dns_rec_type_t type;
  ares_dns_class_t rclass;
  ulong uVar9;
  unsigned_short u16;
  uint ttl;
  ares_dns_rr_t *rr;
  char *name;
  ushort local_56;
  ares_dns_class_t local_54;
  ares_dns_rec_type_t local_50;
  uint local_4c;
  ares_dns_rr_t *local_48;
  char *local_40;
  ulong local_38;
  
  local_40 = (char *)0x0;
  local_48 = (ares_dns_rr_t *)0x0;
  aVar3 = ares_dns_name_parse(buf,&local_40,ARES_FALSE);
  if (((aVar3 != ARES_SUCCESS) ||
      (aVar3 = ares_buf_fetch_be16(buf,&local_56), uVar1 = local_56, aVar3 != ARES_SUCCESS)) ||
     (aVar3 = ares_buf_fetch_be16(buf,&local_56), uVar2 = local_56, aVar3 != ARES_SUCCESS))
  goto LAB_00120de5;
  local_50 = (ares_dns_rec_type_t)uVar1;
  aVar3 = ares_buf_fetch_be32(buf,&local_4c);
  if (aVar3 != ARES_SUCCESS) goto LAB_00120de5;
  local_54 = (ares_dns_class_t)uVar2;
  aVar3 = ares_buf_fetch_be16(buf,&local_56);
  type = local_50;
  if (aVar3 != ARES_SUCCESS) goto LAB_00120de5;
  local_38 = (ulong)local_56;
  aVar4 = ares_dns_rec_type_isvalid(local_50,ARES_FALSE);
  if (aVar4 == ARES_FALSE) {
    type = ARES_REC_TYPE_RAW_RR;
  }
  aVar4 = ares_dns_rec_allow_name_comp(type);
  if (sect == ARES_SECTION_ADDITIONAL) {
    uVar8 = 4;
    if (aVar4 == ARES_FALSE) {
      uVar8 = 0x20;
    }
    if ((uVar8 & flags) != 0) {
      type = ARES_REC_TYPE_RAW_RR;
    }
  }
  else {
    if (sect == ARES_SECTION_AUTHORITY) {
      uVar5 = 0x10;
      uVar8 = 2;
    }
    else {
      if (sect != ARES_SECTION_ANSWER) goto LAB_00120e81;
      uVar5 = 8;
      uVar8 = 1;
    }
    if (aVar4 == ARES_FALSE) {
      uVar8 = uVar5;
    }
    if ((uVar8 & flags) != 0) {
      type = ARES_REC_TYPE_RAW_RR;
    }
  }
LAB_00120e81:
  sVar6 = ares_buf_len(buf);
  rdlength = local_38;
  aVar3 = ARES_EBADRESP;
  if (local_38 <= sVar6) {
    uVar8 = local_4c;
    rclass = local_54;
    if (type == ARES_REC_TYPE_OPT) {
      uVar8 = 0;
      rclass = ARES_CLASS_IN;
    }
    aVar3 = ares_dns_record_rr_add(&local_48,dnsrec,sect,local_40,type,rclass,uVar8);
    if (aVar3 == ARES_SUCCESS) {
      sVar6 = ares_buf_len(buf);
      aVar3 = ares_dns_parse_rr_data
                        (buf,rdlength,local_48,type,(unsigned_short)local_50,
                         (unsigned_short)local_54,local_4c);
      if (aVar3 == ARES_SUCCESS) {
        sVar7 = ares_buf_len(buf);
        uVar9 = sVar6 - sVar7;
        aVar3 = ARES_EBADRESP;
        if (uVar9 <= rdlength) {
          aVar3 = ARES_SUCCESS;
          if (uVar9 <= rdlength && rdlength - uVar9 != 0) {
            ares_buf_consume(buf,rdlength - uVar9);
          }
        }
      }
    }
  }
LAB_00120de5:
  ares_free(local_40);
  return aVar3;
}

Assistant:

static ares_status_t ares_dns_parse_rr(ares_buf_t *buf, unsigned int flags,
                                       ares_dns_section_t sect,
                                       ares_dns_record_t *dnsrec)
{
  char               *name = NULL;
  unsigned short      u16;
  unsigned short      raw_type;
  ares_status_t       status;
  ares_dns_rec_type_t type;
  ares_dns_class_t    qclass;
  unsigned int        ttl;
  size_t              rdlength;
  ares_dns_rr_t      *rr            = NULL;
  size_t              remaining_len = 0;
  size_t              processed_len = 0;
  ares_bool_t         namecomp;

  /* All RRs have the same top level format shown below:
   *                                 1  1  1  1  1  1
   *   0  1  2  3  4  5  6  7  8  9  0  1  2  3  4  5
   * +--+--+--+--+--+--+--+--+--+--+--+--+--+--+--+--+
   * |                                               |
   * /                                               /
   * /                      NAME                     /
   * |                                               |
   * +--+--+--+--+--+--+--+--+--+--+--+--+--+--+--+--+
   * |                      TYPE                     |
   * +--+--+--+--+--+--+--+--+--+--+--+--+--+--+--+--+
   * |                     CLASS                     |
   * +--+--+--+--+--+--+--+--+--+--+--+--+--+--+--+--+
   * |                      TTL                      |
   * |                                               |
   * +--+--+--+--+--+--+--+--+--+--+--+--+--+--+--+--+
   * |                   RDLENGTH                    |
   * +--+--+--+--+--+--+--+--+--+--+--+--+--+--+--+--|
   * /                     RDATA                     /
   * /                                               /
   * +--+--+--+--+--+--+--+--+--+--+--+--+--+--+--+--+
   */

  /* Name */
  status = ares_dns_name_parse(buf, &name, ARES_FALSE);
  if (status != ARES_SUCCESS) {
    goto done;
  }

  /* Type */
  status = ares_buf_fetch_be16(buf, &u16);
  if (status != ARES_SUCCESS) {
    goto done;
  }
  type     = u16;
  raw_type = u16; /* Only used for raw rr data */

  /* Class */
  status = ares_buf_fetch_be16(buf, &u16);
  if (status != ARES_SUCCESS) {
    goto done;
  }
  qclass = u16;

  /* TTL */
  status = ares_buf_fetch_be32(buf, &ttl);
  if (status != ARES_SUCCESS) {
    goto done;
  }

  /* Length */
  status = ares_buf_fetch_be16(buf, &u16);
  if (status != ARES_SUCCESS) {
    goto done;
  }
  rdlength = u16;

  if (!ares_dns_rec_type_isvalid(type, ARES_FALSE)) {
    type = ARES_REC_TYPE_RAW_RR;
  }

  namecomp = ares_dns_rec_allow_name_comp(type);
  if (sect == ARES_SECTION_ANSWER &&
      (flags &
       (namecomp ? ARES_DNS_PARSE_AN_BASE_RAW : ARES_DNS_PARSE_AN_EXT_RAW))) {
    type = ARES_REC_TYPE_RAW_RR;
  }
  if (sect == ARES_SECTION_AUTHORITY &&
      (flags &
       (namecomp ? ARES_DNS_PARSE_NS_BASE_RAW : ARES_DNS_PARSE_NS_EXT_RAW))) {
    type = ARES_REC_TYPE_RAW_RR;
  }
  if (sect == ARES_SECTION_ADDITIONAL &&
      (flags &
       (namecomp ? ARES_DNS_PARSE_AR_BASE_RAW : ARES_DNS_PARSE_AR_EXT_RAW))) {
    type = ARES_REC_TYPE_RAW_RR;
  }

  /* Pull into another buffer for safety */
  if (rdlength > ares_buf_len(buf)) {
    status = ARES_EBADRESP;
    goto done;
  }

  /* Add the base rr */
  status =
    ares_dns_record_rr_add(&rr, dnsrec, sect, name, type,
                           type == ARES_REC_TYPE_OPT ? ARES_CLASS_IN : qclass,
                           type == ARES_REC_TYPE_OPT ? 0 : ttl);
  if (status != ARES_SUCCESS) {
    goto done;
  }

  /* Record the current remaining length in the buffer so we can tell how
   * much was processed */
  remaining_len = ares_buf_len(buf);

  /* Fill in the data for the rr */
  status = ares_dns_parse_rr_data(buf, rdlength, rr, type, raw_type,
                                  (unsigned short)qclass, ttl);
  if (status != ARES_SUCCESS) {
    goto done;
  }

  /* Determine how many bytes were processed */
  processed_len = remaining_len - ares_buf_len(buf);

  /* If too many bytes were processed, error! */
  if (processed_len > rdlength) {
    status = ARES_EBADRESP;
    goto done;
  }

  /* If too few bytes were processed, consume the unprocessed data for this
   * record as the parser may not have wanted/needed to use it */
  if (processed_len < rdlength) {
    ares_buf_consume(buf, rdlength - processed_len);
  }


done:
  ares_free(name);
  return status;
}